

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image.c
# Opt level: O2

image * load_png_image_from_file(FILE *fp)

{
  undefined1 auVar1 [13];
  byte bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  __jmp_buf_tag *__env;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  image *image;
  size_t i;
  ulong uVar10;
  size_t i_1;
  ulong uVar11;
  size_t sVar12;
  png_infop *pppVar13;
  size_t sVar14;
  byte *pbVar15;
  size_t j;
  ulong uVar16;
  png_structp png_ptr;
  byte local_89;
  png_infop info_ptr;
  void *local_80;
  long local_78;
  byte *local_70;
  void *local_68;
  size_t local_60;
  rgba local_58;
  rgba local_48;
  char sig [8];
  
  fread(sig,1,8,(FILE *)fp);
  iVar4 = png_sig_cmp(sig,0,8);
  if ((iVar4 == 0) &&
     (png_ptr = (png_structp)png_create_read_struct("1.6.37",0,0,0), png_ptr != (png_structp)0x0)) {
    info_ptr = (png_infop)png_create_info_struct(png_ptr);
    if (info_ptr == (png_infop)0x0) {
      pppVar13 = (png_infop *)0x0;
    }
    else {
      __env = (__jmp_buf_tag *)png_set_longjmp_fn(png_ptr,longjmp,200);
      iVar4 = _setjmp(__env);
      if (iVar4 == 0) {
        png_set_sig_bytes(png_ptr,8);
        png_init_io(png_ptr,fp);
        png_read_info(png_ptr,info_ptr);
        uVar5 = png_get_image_width(png_ptr,info_ptr);
        uVar6 = png_get_image_height(png_ptr,info_ptr);
        bVar2 = png_get_color_type(png_ptr,info_ptr);
        cVar3 = png_get_bit_depth(png_ptr,info_ptr);
        if (bVar2 == 3) {
          png_set_palette_to_rgb(png_ptr);
        }
        else if ((bVar2 & 0xfb) == 0) {
          png_set_gray_to_rgb(png_ptr);
        }
        uVar11 = (ulong)uVar5;
        uVar16 = (ulong)uVar6;
        if (cVar3 == '\x10') {
          png_set_strip_16(png_ptr);
        }
        iVar4 = png_get_valid(png_ptr,info_ptr,0x10);
        if (iVar4 == 0) {
          local_89 = bVar2 >> 2;
        }
        else {
          png_set_tRNS_to_alpha(png_ptr);
          local_89 = 1;
        }
        sVar14 = (ulong)(local_89 & 1) + 3;
        pvVar7 = xmalloc(uVar16 * 8);
        local_78 = sVar14 * uVar11;
        pvVar8 = xmalloc(sVar14 * uVar11 * uVar16);
        pvVar9 = pvVar8;
        for (uVar10 = 0; uVar16 != uVar10; uVar10 = uVar10 + 1) {
          *(void **)((long)pvVar7 + uVar10 * 8) = pvVar9;
          pvVar9 = (void *)((long)pvVar9 + local_78);
        }
        local_80 = pvVar8;
        local_68 = pvVar7;
        png_read_image(png_ptr,pvVar7);
        image = (image *)xmalloc(sVar14 * 8 + 0x18);
        image->width = uVar11;
        image->height = uVar16;
        image->channel_count = sVar14;
        local_60 = uVar16;
        for (sVar12 = 0; sVar14 != sVar12; sVar12 = sVar12 + 1) {
          pvVar9 = xmalloc(uVar11 * uVar16 * 4);
          (&image[1].width)[sVar12] = (size_t)pvVar9;
        }
        pbVar15 = (byte *)((long)pvVar8 + 2);
        pvVar9 = local_80;
        for (sVar14 = 0; sVar14 != local_60; sVar14 = sVar14 + 1) {
          local_70 = pbVar15;
          if ((local_89 & 1) == 0) {
            for (sVar12 = 0; uVar11 != sVar12; sVar12 = sVar12 + 1) {
              uVar5 = *(uint *)((long)pvVar9 + sVar12 * 4);
              auVar1[0xc] = (char)(uVar5 >> 0x18);
              auVar1._0_12_ = ZEXT712(0);
              local_48.r = (float)(uVar5 & 0xff) * 0.003921569;
              local_48.g = (float)(uVar5 >> 8 & 0xff) * 0.003921569;
              local_48.b = (float)(int)CONCAT32(auVar1._10_3_,(ushort)(byte)(uVar5 >> 0x10)) *
                           0.003921569;
              local_48.a = (float)(uint3)(auVar1._10_3_ >> 0x10) * 0.003921569;
              set_rgba_pixel(image,sVar12,sVar14,&local_48);
            }
          }
          else {
            for (sVar12 = 0; uVar11 != sVar12; sVar12 = sVar12 + 1) {
              local_58.r = (float)(*(ushort *)(pbVar15 + -2) & 0xff) * 0.003921569;
              local_58.g = (float)(byte)(*(ushort *)(pbVar15 + -2) >> 8) * 0.003921569;
              local_58.b = (float)*pbVar15 * 0.003921569;
              local_58.a = 0.0;
              set_rgba_pixel(image,sVar12,sVar14,&local_58);
              pbVar15 = pbVar15 + 3;
            }
          }
          pvVar9 = (void *)((long)pvVar9 + local_78);
          pbVar15 = local_70 + local_78;
        }
        free(local_68);
        free(local_80);
        png_destroy_read_struct(&png_ptr,&info_ptr,0);
        return image;
      }
      pppVar13 = &info_ptr;
    }
    png_destroy_read_struct(&png_ptr,pppVar13,0);
  }
  return (image *)0x0;
}

Assistant:

static struct image* load_png_image_from_file(FILE* fp) {
    char sig[8];
    fread(sig, 1, 8, fp);
    if (!png_check_sig((unsigned char*)sig, 8))
        return NULL;

    png_structp png_ptr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    if (!png_ptr)
        return NULL;

    png_infop info_ptr = png_create_info_struct(png_ptr);
    if (!info_ptr) {
        png_destroy_read_struct(&png_ptr, NULL, NULL);
        return NULL;
    }

    struct image* image = NULL;
    png_byte** row_ptrs = NULL;
    png_byte* row_bytes = NULL;
    if (setjmp(png_jmpbuf(png_ptr))) {
        if (image)     free_image(image);
        if (row_ptrs)  free(row_ptrs);
        if (row_bytes) free(row_bytes);
        png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
        return NULL;
    }

    png_set_sig_bytes(png_ptr, 8);
    png_init_io(png_ptr, fp);
    png_read_info(png_ptr, info_ptr);

    size_t width  = png_get_image_width(png_ptr, info_ptr);
    size_t height = png_get_image_height(png_ptr, info_ptr);

    png_uint_32 color_type = png_get_color_type(png_ptr, info_ptr);
    png_uint_32 bit_depth  = png_get_bit_depth(png_ptr, info_ptr);

    // Expand paletted and grayscale images to RGB
    if (color_type == PNG_COLOR_TYPE_PALETTE)
        png_set_palette_to_rgb(png_ptr);
    else if (
        color_type == PNG_COLOR_TYPE_GRAY ||
        color_type == PNG_COLOR_TYPE_GRAY_ALPHA)
        png_set_gray_to_rgb(png_ptr);

    // Transform to 8 bit per channel
    if (bit_depth == 16)
        png_set_strip_16(png_ptr);

    // Get alpha channel when there is one
    bool has_alpha = color_type & PNG_COLOR_MASK_ALPHA;
    if (png_get_valid(png_ptr, info_ptr, PNG_INFO_tRNS)) {
        png_set_tRNS_to_alpha(png_ptr);
        has_alpha = true;
    }

    size_t channel_count = has_alpha ? 4 : 3;
    size_t stride = width * channel_count;
    row_ptrs  = xmalloc(sizeof(png_byte*) * height);
    row_bytes = xmalloc(sizeof(png_byte) * stride * height);
    for (size_t i = 0; i < height; ++i)
        row_ptrs[i] = row_bytes + stride * i;
    png_read_image(png_ptr, row_ptrs);

    // Transform the byte data into a floating point image
    image = new_image(width, height, channel_count);
    for (size_t i = 0; i < height; ++i) {
        const png_byte* row = row_bytes + stride * i;
        const real_t scale = (real_t)1 / (real_t)255;
        if (has_alpha) {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 3 + 0] * scale,
                    .g = (real_t)row[j * 3 + 1] * scale,
                    .b = (real_t)row[j * 3 + 2] * scale,
                });
            }
        } else {
            for (size_t j = 0; j < width; ++j) {
                set_rgba_pixel(image, j, i, &(struct rgba) {
                    .r = (real_t)row[j * 4 + 0] * scale,
                    .g = (real_t)row[j * 4 + 1] * scale,
                    .b = (real_t)row[j * 4 + 2] * scale,
                    .a = (real_t)row[j * 4 + 3] * scale
                });
            }
        }
    }
    free(row_ptrs);
    free(row_bytes);
    row_ptrs = NULL;
    row_bytes = NULL;

    png_destroy_read_struct(&png_ptr, &info_ptr, NULL);
    return image;
}